

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

int help_monster_out(monst *mtmp,trap *ttmp)

{
  byte bVar1;
  permonst *pm;
  bool bVar2;
  boolean bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  obj *poVar9;
  char *pcVar10;
  bool bVar11;
  char kbuf [256];
  char acStack_138 [264];
  
  bVar2 = true;
  if ((mtmp->data == mons + 0xdb) && ((mtmp->field_0x61 & 1) == 0)) {
    bVar2 = mtmp->mhp < 7;
  }
  if ((mtmp->field_0x62 & 0x80) == 0) {
    pcVar8 = Monnam(mtmp);
    pcVar10 = "%s isn\'t trapped.";
    iVar6 = 0;
LAB_0026c30f:
    pline(pcVar10,pcVar8);
    return iVar6;
  }
  bVar3 = check_capacity((char *)0x0);
  iVar6 = 1;
  if (bVar3 != '\0') {
    return 1;
  }
  iVar4 = untrap_prob(ttmp);
  if (((char)iVar4 != '\0') && ((*(uint *)&mtmp->field_0x60 & 0xc0000) == 0x40000)) {
    pcVar8 = body_part(0);
    pcVar8 = makeplural(pcVar8);
    pcVar10 = mon_nam(mtmp);
    pline("You try to reach out your %s, but %s backs away skeptically.",pcVar8,pcVar10);
    return 1;
  }
  pm = mtmp->data;
  if ((((pm == mons + 0xc) || (pm == mons + 0xb)) && (uarmg == (obj *)0x0)) &&
     ((u.uprops[8].extrinsic == 0 && (((byte)youmonst.mintrinsics & 0x80) == 0)))) {
    pcVar8 = mons_mname(pm);
    pcVar10 = body_part(6);
    pcVar10 = makeplural(pcVar10);
    pline("You grab the trapped %s using your bare %s.",pcVar8,pcVar10);
    bVar3 = poly_when_stoned(youmonst.data);
    if ((bVar3 == '\0') || (iVar5 = polymon(0x108), iVar5 == 0)) {
      pcVar8 = mons_mname(mtmp->data);
      pcVar8 = an(pcVar8);
      sprintf(acStack_138,"trying to help %s out of a pit",pcVar8);
      delayed_petrify((char *)0x0,acStack_138);
      pline("You pull back!");
      return 1;
    }
    (*windowprocs.win_pause)(P_MESSAGE);
  }
  if ((char)iVar4 != '\0') {
    if ((bVar2) ||
       ((uarmg != (obj *)0x0 &&
        (((objects[uarmg->otyp].oc_oprop == '\x04' ||
          (bVar3 = obj_resists(uarmg,5,0x32), bVar3 != '\0')) ||
         (bVar3 = is_quest_artifact(uarmg), bVar3 != '\0')))))) {
      pcVar8 = mon_nam(mtmp);
      pline("You try to grab %s, but cannot get a firm grasp.",pcVar8);
    }
    else {
      pcVar8 = mons_mname(mtmp->data);
      pcVar8 = an(pcVar8);
      sprintf(acStack_138,"trying to help %s out of a pit",pcVar8);
      mon_nam(mtmp);
      pline("You try to grab %s, but...");
      if (uarmg == (obj *)0x0) {
        iVar4 = instadisintegrate(acStack_138);
        if (iVar4 == 0) {
          pline("You cannot get a firm grasp.");
        }
      }
      else {
        destroy_arm(uarmg,'\0');
      }
    }
    if ((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) == 0) {
      return 1;
    }
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfff7ffff;
    pcVar8 = Monnam(mtmp);
    pcVar10 = "%s awakens.";
    goto LAB_0026c30f;
  }
  pcVar8 = body_part(0);
  pcVar8 = makeplural(pcVar8);
  pcVar10 = mon_nam(mtmp);
  pline("You reach out your %s and grab %s.",pcVar8,pcVar10);
  bVar11 = true;
  if (!bVar2) {
    pcVar8 = mons_mname(mtmp->data);
    pcVar8 = an(pcVar8);
    sprintf(acStack_138,"trying to help %s out of a pit",pcVar8);
    if (uarmg != (obj *)0x0) {
      bVar11 = true;
      if (((objects[uarmg->otyp].oc_oprop == '\x04') ||
          (bVar3 = obj_resists(uarmg,5,0x32), bVar3 != '\0')) ||
         (bVar3 = is_quest_artifact(uarmg), bVar3 != '\0')) goto LAB_0026c5b0;
      destroy_arm(uarmg,'\0');
    }
    iVar6 = instadisintegrate(acStack_138);
    bVar11 = iVar6 == 0;
  }
LAB_0026c5b0:
  if ((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) == 0) {
    bVar1 = mtmp->mfrozen;
    if ((bVar1 == 0) || (uVar7 = mt_random(), uVar7 % (uint)bVar1 != 0)) goto LAB_0026c60a;
    mtmp->field_0x62 = mtmp->field_0x62 | 4;
    mtmp->mfrozen = '\0';
    pcVar8 = "%s stirs.";
  }
  else {
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfff7ffff;
    pcVar8 = "%s awakens.";
  }
  pcVar10 = Monnam(mtmp);
  pline(pcVar8,pcVar10);
LAB_0026c60a:
  if (!bVar11) {
    return 1;
  }
  iVar6 = inv_weight();
  iVar6 = (uint)mtmp->data->cwt + iVar6;
  iVar4 = try_lift(mtmp,ttmp,iVar6,'\0');
  if (iVar4 == 0) {
    return 1;
  }
  for (poVar9 = mtmp->minvent; poVar9 != (obj *)0x0; poVar9 = poVar9->nobj) {
    iVar6 = iVar6 + poVar9->owt;
  }
  iVar6 = try_lift(mtmp,ttmp,iVar6,'\x01');
  if (iVar6 == 0) {
    return 1;
  }
  pcVar8 = mon_nam(mtmp);
  pline("You pull %s out of the pit.",pcVar8);
  mtmp->field_0x62 = mtmp->field_0x62 & 0x7f;
  fill_pit(level,(int)mtmp->mx,(int)mtmp->my);
  reward_untrap(ttmp,mtmp);
  return 1;
}

Assistant:

static int help_monster_out(struct monst *mtmp, struct trap *ttmp)
{
	int wt;
	struct obj *otmp;
	boolean uprob;
	boolean udied = FALSE;
	boolean can_disint = (touch_disintegrates(mtmp->data) &&
			      !mtmp->mcan &&
			      mtmp->mhp > 6);

	/*
	 * This works when levitating too -- consistent with the ability
	 * to hit monsters while levitating.
	 *
	 * Should perhaps check that our hero has arms/hands at the
	 * moment.  Helping can also be done by engulfing...
	 *
	 * Test the monster first - monsters are displayed before traps.
	 */
	if (!mtmp->mtrapped) {
		pline("%s isn't trapped.", Monnam(mtmp));
		return 0;
	}
	/* Do you have the necessary capacity to lift anything? */
	if (check_capacity(NULL)) return 1;

	/* Will our hero succeed? */
	if ((uprob = untrap_prob(ttmp)) && !mtmp->msleeping && mtmp->mcanmove) {
		pline("You try to reach out your %s, but %s backs away skeptically.",
			makeplural(body_part(ARM)),
			mon_nam(mtmp));
		return 1;
	}


	/* is it a cockatrice?... */
	if (touch_petrifies(mtmp->data) && !uarmg && !Stone_resistance) {
		pline("You grab the trapped %s using your bare %s.",
				mons_mname(mtmp->data), makeplural(body_part(HAND)));

		if (poly_when_stoned(youmonst.data) && polymon(PM_STONE_GOLEM))
			win_pause_output(P_MESSAGE);
		else {
			char kbuf[BUFSZ];

			sprintf(kbuf, "trying to help %s out of a pit",
					an(mons_mname(mtmp->data)));
			delayed_petrify(NULL, kbuf);
			pline("You pull back!");
			return 1;
		}
	}
	/* need to do cockatrice check first if sleeping or paralyzed */
	if (uprob) {
	    if (can_disint && (!(uarmg) || !oresist_disintegration(uarmg))) {
		char kbuf[BUFSZ];
		sprintf(kbuf, "trying to help %s out of a pit",
			an(mons_mname(mtmp->data)));
		pline("You try to grab %s, but...", mon_nam(mtmp));
		if (uarmg) {
		    destroy_arm(uarmg, FALSE);
		} else {
		    if (!instadisintegrate(kbuf))
			pline("You cannot get a firm grasp.");
		}
	    } else {
		pline("You try to grab %s, but cannot get a firm grasp.",
		      mon_nam(mtmp));
	    }
	    if (mtmp->msleeping) {
		mtmp->msleeping = 0;
		pline("%s awakens.", Monnam(mtmp));
	    }
	    return 1;
	}

	pline("You reach out your %s and grab %s.",
	    makeplural(body_part(ARM)), mon_nam(mtmp));

	if (can_disint) {
	    char kbuf[BUFSZ];
	    sprintf(kbuf, "trying to help %s out of a pit",
		    an(mons_mname(mtmp->data)));
	    if (uarmg) {
		if (!oresist_disintegration(uarmg)) {
		    /* The destroy_arm(..., FALSE) could cause problems since
		       that FALSE should be whether the player survives the
		       instadisintegrate() call below it, but in practice it
		       doesn't matter since it destroys gloves and not
		       (potentially petrify-resistant) body armor. */
		    destroy_arm(uarmg, FALSE);
		    udied = instadisintegrate(kbuf) ? 1 : 0;
		}
	    } else {
		udied = (instadisintegrate(kbuf)) ? 1 : 0;
	    }
	}

	if (mtmp->msleeping) {
	    mtmp->msleeping = 0;
	    pline("%s awakens.", Monnam(mtmp));
	} else if (mtmp->mfrozen && !rn2(mtmp->mfrozen)) {
	    /* After such manhandling, perhaps the effect wears off */
	    mtmp->mcanmove = 1;
	    mtmp->mfrozen = 0;
	    pline("%s stirs.", Monnam(mtmp));
	}

	if (udied) return 1;

	/* is the monster too heavy? */
	wt = inv_weight() + mtmp->data->cwt;
	if (!try_lift(mtmp, ttmp, wt, FALSE)) return 1;

	/* is the monster with inventory too heavy? */
	for (otmp = mtmp->minvent; otmp; otmp = otmp->nobj)
		wt += otmp->owt;
	if (!try_lift(mtmp, ttmp, wt, TRUE)) return 1;

	pline("You pull %s out of the pit.", mon_nam(mtmp));
	mtmp->mtrapped = 0;
	fill_pit(level, mtmp->mx, mtmp->my);
	reward_untrap(ttmp, mtmp);
	return 1;
}